

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

StringRef __thiscall
Catch::anon_unknown_23::extractFilenamePart(anon_unknown_23 *this,StringRef filename)

{
  anon_unknown_23 *paVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  char *pcVar5;
  ulong uVar6;
  long lVar7;
  StringRef SVar8;
  
  pcVar5 = filename.m_start;
  lVar2 = 0;
  do {
    lVar3 = lVar2;
    if (pcVar5 + lVar3 == (char *)0x0) break;
    lVar2 = lVar3 + -1;
  } while ((pcVar5 + (long)this)[lVar3 + -1] != '.');
  lVar2 = lVar3;
  uVar6 = 0;
  do {
    uVar4 = uVar6;
    lVar7 = lVar2;
    if (pcVar5 + lVar7 == (char *)0x1) break;
    if (pcVar5 <= pcVar5 + lVar3 + -2) {
      __assert_fail("index < m_size",
                    "/workspace/llm4binary/github/license_c_cmakelists/H-EAL[P]oqpi/tests/catch_amalgamated.hpp"
                    ,0x2ac,"char Catch::StringRef::operator[](size_type) const");
    }
    if ((this + (long)pcVar5)[lVar7 + -2] == (anon_unknown_23)0x5c) break;
    lVar2 = lVar7 + -1;
    uVar6 = uVar4 + 1;
  } while ((this + (long)pcVar5)[lVar7 + -2] != (anon_unknown_23)0x2f);
  uVar6 = 1U - lVar7;
  if (uVar4 <= 1U - lVar7) {
    uVar6 = uVar4;
  }
  uVar4 = 0;
  paVar1 = (anon_unknown_23 *)0x1cf5dc;
  if (pcVar5 + lVar7 + -1 < pcVar5) {
    uVar4 = uVar6;
    paVar1 = this + -1 + (long)(pcVar5 + lVar7);
  }
  SVar8.m_size = uVar4;
  SVar8.m_start = (char *)paVar1;
  return SVar8;
}

Assistant:

StringRef extractFilenamePart(StringRef filename) {
            size_t lastDot = filename.size();
            while (lastDot > 0 && filename[lastDot - 1] != '.') {
                --lastDot;
            }
            --lastDot;

            size_t nameStart = lastDot;
            while (nameStart > 0 && filename[nameStart - 1] != '/' && filename[nameStart - 1] != '\\') {
                --nameStart;
            }

            return filename.substr(nameStart, lastDot - nameStart);
        }